

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverse_suite.cpp
# Opt level: O0

void reverse_map(void)

{
  basic_variable<std::allocator<char>_> *local_e60;
  basic_variable<std::allocator<char>_> *local_e48;
  basic_variable<std::allocator<char>_> *local_e30;
  basic_variable<std::allocator<char>_> *local_e18;
  basic_variable<std::allocator<char>_> *local_e00;
  basic_variable<std::allocator<char>_> *local_de8;
  basic_variable<std::allocator<char>_> *local_dd0;
  basic_variable<std::allocator<char>_> *local_db8;
  basic_variable<std::allocator<char>_> *local_da0;
  basic_variable<std::allocator<char>_> *local_d50;
  basic_variable<std::allocator<char>_> *local_d38;
  basic_variable<std::allocator<char>_> *local_d20;
  basic_variable<std::allocator<char>_> *local_d08;
  basic_variable<std::allocator<char>_> *local_cf0;
  basic_variable<std::allocator<char>_> *local_cd8;
  basic_variable<std::allocator<char>_> *local_cc0;
  basic_variable<std::allocator<char>_> *local_ca8;
  basic_variable<std::allocator<char>_> *local_c90;
  iterator local_c48;
  iterator local_c30;
  iterator local_c18;
  iterator local_c00;
  undefined1 local_be5;
  nullable local_be4;
  basic_variable<std::allocator<char>_> *local_be0;
  basic_variable<std::allocator<char>_> local_bd8;
  basic_variable<std::allocator<char>_> local_ba8;
  undefined1 auStack_b78 [32];
  basic_variable<std::allocator<char>_> local_b58;
  basic_variable<std::allocator<char>_> local_b28;
  undefined1 auStack_af8 [32];
  basic_variable<std::allocator<char>_> local_ad8;
  basic_variable<std::allocator<char>_> local_aa8;
  undefined1 auStack_a78 [32];
  basic_variable<std::allocator<char>_> local_a58;
  basic_variable<std::allocator<char>_> local_a28;
  undefined1 auStack_9f8 [32];
  basic_variable<std::allocator<char>_> local_9d8;
  basic_variable<std::allocator<char>_> local_9a8;
  undefined1 auStack_978 [32];
  basic_variable<std::allocator<char>_> local_958;
  basic_variable<std::allocator<char>_> local_928;
  undefined1 auStack_8f8 [32];
  basic_variable<std::allocator<char>_> local_8d8;
  basic_variable<std::allocator<char>_> local_8a8;
  undefined1 auStack_878 [32];
  basic_variable<std::allocator<char>_> local_858;
  basic_variable<std::allocator<char>_> local_828;
  undefined1 auStack_7f8 [32];
  basic_variable<std::allocator<char>_> local_7d8;
  basic_variable<std::allocator<char>_> local_7a8;
  basic_variable<std::allocator<char>_> local_778;
  basic_variable<std::allocator<char>_> local_748;
  basic_variable<std::allocator<char>_> local_718;
  basic_variable<std::allocator<char>_> local_6e8;
  basic_variable<std::allocator<char>_> local_6b8;
  basic_variable<std::allocator<char>_> local_688;
  undefined1 local_658 [24];
  variable expect;
  iterator local_600;
  undefined1 local_5e1;
  basic_variable<std::allocator<char>_> *local_5e0;
  basic_variable<std::allocator<char>_> local_5d8;
  basic_variable<std::allocator<char>_> local_5a8;
  undefined1 auStack_578 [32];
  basic_variable<std::allocator<char>_> local_558;
  basic_variable<std::allocator<char>_> local_528;
  undefined1 auStack_4f8 [32];
  basic_variable<std::allocator<char>_> local_4d8;
  basic_variable<std::allocator<char>_> local_4a8;
  undefined1 auStack_478 [32];
  basic_variable<std::allocator<char>_> local_458;
  basic_variable<std::allocator<char>_> local_428;
  undefined1 auStack_3f8 [32];
  basic_variable<std::allocator<char>_> local_3d8;
  basic_variable<std::allocator<char>_> local_3a8;
  undefined1 auStack_378 [32];
  basic_variable<std::allocator<char>_> local_358;
  basic_variable<std::allocator<char>_> local_328;
  undefined1 auStack_2f8 [32];
  basic_variable<std::allocator<char>_> local_2d8;
  basic_variable<std::allocator<char>_> local_2a8;
  undefined1 auStack_278 [24];
  nullable local_260 [4];
  basic_variable<std::allocator<char>_> *local_250;
  basic_variable<std::allocator<char>_> local_248;
  basic_variable<std::allocator<char>_> local_218;
  undefined1 auStack_1e8 [32];
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  basic_variable<std::allocator<char>_> local_168;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  local_5e1 = 1;
  auStack_1e8._24_8_ = &local_1c8;
  local_250 = &local_248;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_250,"alpha");
  local_250 = &local_218;
  local_260[0] = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_250,local_260);
  auStack_1e8._8_8_ = &local_248;
  auStack_1e8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_1c8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_1e8 + 8));
  auStack_2f8._24_8_ = &local_2d8;
  auStack_1e8._24_8_ = &local_198;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_2f8._24_8_,"bravo");
  auStack_2f8._24_8_ = &local_2a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)auStack_2f8._24_8_,true);
  auStack_278._8_8_ = &local_2d8;
  auStack_278._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_198,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_278 + 8));
  auStack_378._24_8_ = &local_358;
  auStack_1e8._24_8_ = &local_168;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_378._24_8_,"charlie");
  auStack_378._24_8_ = &local_328;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)auStack_378._24_8_,2);
  auStack_2f8._8_8_ = &local_358;
  auStack_2f8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_168,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_2f8 + 8));
  auStack_3f8._24_8_ = &local_3d8;
  auStack_1e8._24_8_ = &local_138;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_3f8._24_8_,"delta");
  auStack_3f8._24_8_ = &local_3a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)auStack_3f8._24_8_,3.0);
  auStack_378._8_8_ = &local_3d8;
  auStack_378._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_138,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_378 + 8));
  auStack_478._24_8_ = &local_458;
  auStack_1e8._24_8_ = &local_108;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_478._24_8_,"echo");
  auStack_478._24_8_ = &local_428;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_478._24_8_,"hydrogen");
  auStack_3f8._8_8_ = &local_458;
  auStack_3f8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_108,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_3f8 + 8));
  auStack_4f8._24_8_ = &local_4d8;
  auStack_1e8._24_8_ = &local_d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_4f8._24_8_,"foxtrot");
  auStack_4f8._24_8_ = &local_4a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_4f8._24_8_,L"helium");
  auStack_478._8_8_ = &local_4d8;
  auStack_478._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_d8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_478 + 8));
  auStack_578._24_8_ = &local_558;
  auStack_1e8._24_8_ = &local_a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_578._24_8_,"golf");
  auStack_578._24_8_ = &local_528;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_578._24_8_,L"lithium");
  auStack_4f8._8_8_ = &local_558;
  auStack_4f8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_a8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_4f8 + 8));
  local_5e0 = &local_5d8;
  auStack_1e8._24_8_ = &local_78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_5e0,"hotel");
  local_5e0 = &local_5a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_5e0,L"beryllium");
  auStack_578._8_8_ = &local_5d8;
  auStack_578._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_78,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_578 + 8));
  local_5e1 = 0;
  local_48._0_8_ = &local_1c8;
  local_48._8_8_ = 8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_48);
  local_c90 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_c90 = local_c90 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_c90);
  } while (local_c90 != &local_1c8);
  local_ca8 = (basic_variable<std::allocator<char>_> *)auStack_578;
  do {
    local_ca8 = local_ca8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_ca8);
  } while (local_ca8 != &local_5d8);
  local_cc0 = (basic_variable<std::allocator<char>_> *)auStack_4f8;
  do {
    local_cc0 = local_cc0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_cc0);
  } while (local_cc0 != &local_558);
  local_cd8 = (basic_variable<std::allocator<char>_> *)auStack_478;
  do {
    local_cd8 = local_cd8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_cd8);
  } while (local_cd8 != &local_4d8);
  local_cf0 = (basic_variable<std::allocator<char>_> *)auStack_3f8;
  do {
    local_cf0 = local_cf0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_cf0);
  } while (local_cf0 != &local_458);
  local_d08 = (basic_variable<std::allocator<char>_> *)auStack_378;
  do {
    local_d08 = local_d08 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d08);
  } while (local_d08 != &local_3d8);
  local_d20 = (basic_variable<std::allocator<char>_> *)auStack_2f8;
  do {
    local_d20 = local_d20 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d20);
  } while (local_d20 != &local_358);
  local_d38 = (basic_variable<std::allocator<char>_> *)auStack_278;
  do {
    local_d38 = local_d38 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d38);
  } while (local_d38 != &local_2d8);
  local_d50 = (basic_variable<std::allocator<char>_> *)auStack_1e8;
  do {
    local_d50 = local_d50 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d50);
  } while (local_d50 != &local_248);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_600,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)&expect.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::reverse<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            (&local_600,(iterator *)&expect.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)&expect.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_600);
  local_be5 = 1;
  auStack_7f8._24_8_ = &local_7d8;
  auStack_878._24_8_ = &local_858;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_878._24_8_,"alpha");
  auStack_878._24_8_ = &local_828;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_878._24_8_,L"beryllium");
  auStack_7f8._8_8_ = &local_858;
  auStack_7f8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_7d8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_7f8 + 8));
  auStack_8f8._24_8_ = &local_8d8;
  auStack_7f8._24_8_ = &local_7a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_8f8._24_8_,"bravo");
  auStack_8f8._24_8_ = &local_8a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_8f8._24_8_,L"lithium");
  auStack_878._8_8_ = &local_8d8;
  auStack_878._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_7a8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_878 + 8));
  auStack_978._24_8_ = &local_958;
  auStack_7f8._24_8_ = &local_778;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_978._24_8_,"charlie");
  auStack_978._24_8_ = &local_928;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_978._24_8_,L"helium");
  auStack_8f8._8_8_ = &local_958;
  auStack_8f8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_778,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_8f8 + 8));
  auStack_9f8._24_8_ = &local_9d8;
  auStack_7f8._24_8_ = &local_748;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_9f8._24_8_,"delta");
  auStack_9f8._24_8_ = &local_9a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_9f8._24_8_,"hydrogen");
  auStack_978._8_8_ = &local_9d8;
  auStack_978._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_748,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_978 + 8));
  auStack_a78._24_8_ = &local_a58;
  auStack_7f8._24_8_ = &local_718;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_a78._24_8_,"echo");
  auStack_a78._24_8_ = &local_a28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)auStack_a78._24_8_,3.0);
  auStack_9f8._8_8_ = &local_a58;
  auStack_9f8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_718,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_9f8 + 8));
  auStack_af8._24_8_ = &local_ad8;
  auStack_7f8._24_8_ = &local_6e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_af8._24_8_,"foxtrot");
  auStack_af8._24_8_ = &local_aa8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)auStack_af8._24_8_,2);
  auStack_a78._8_8_ = &local_ad8;
  auStack_a78._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_6e8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_a78 + 8));
  auStack_b78._24_8_ = &local_b58;
  auStack_7f8._24_8_ = &local_6b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_b78._24_8_,"golf");
  auStack_b78._24_8_ = &local_b28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)auStack_b78._24_8_,true);
  auStack_af8._8_8_ = &local_b58;
  auStack_af8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_6b8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_af8 + 8));
  local_be0 = &local_bd8;
  auStack_7f8._24_8_ = &local_688;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_be0,"hotel");
  local_be0 = &local_ba8;
  local_be4 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_be0,&local_be4);
  auStack_b78._8_8_ = &local_bd8;
  auStack_b78._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_688,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_b78 + 8));
  local_be5 = 0;
  local_658._0_8_ = &local_7d8;
  local_658._8_8_ = 8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_658 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_658);
  local_da0 = (basic_variable<std::allocator<char>_> *)local_658;
  do {
    local_da0 = local_da0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_da0);
  } while (local_da0 != &local_7d8);
  local_db8 = (basic_variable<std::allocator<char>_> *)auStack_b78;
  do {
    local_db8 = local_db8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_db8);
  } while (local_db8 != &local_bd8);
  local_dd0 = (basic_variable<std::allocator<char>_> *)auStack_af8;
  do {
    local_dd0 = local_dd0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_dd0);
  } while (local_dd0 != &local_b58);
  local_de8 = (basic_variable<std::allocator<char>_> *)auStack_a78;
  do {
    local_de8 = local_de8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_de8);
  } while (local_de8 != &local_ad8);
  local_e00 = (basic_variable<std::allocator<char>_> *)auStack_9f8;
  do {
    local_e00 = local_e00 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_e00);
  } while (local_e00 != &local_a58);
  local_e18 = (basic_variable<std::allocator<char>_> *)auStack_978;
  do {
    local_e18 = local_e18 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_e18);
  } while (local_e18 != &local_9d8);
  local_e30 = (basic_variable<std::allocator<char>_> *)auStack_8f8;
  do {
    local_e30 = local_e30 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_e30);
  } while (local_e30 != &local_958);
  local_e48 = (basic_variable<std::allocator<char>_> *)auStack_878;
  do {
    local_e48 = local_e48 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_e48);
  } while (local_e48 != &local_8d8);
  local_e60 = (basic_variable<std::allocator<char>_> *)auStack_7f8;
  do {
    local_e60 = local_e60 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_e60);
  } while (local_e60 != &local_858);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_c00,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_c18,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_c30,(basic_variable<std::allocator<char>_> *)(local_658 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_c48,(basic_variable<std::allocator<char>_> *)(local_658 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/reverse_suite.cpp"
             ,0x6e,"void reverse_map()",&local_c00,&local_c18,&local_c30,&local_c48);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c48);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c30);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c18);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c00);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_658 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void reverse_map()
{
    variable data =
        {
            { "alpha", null },
            { "bravo", true },
            { "charlie", 2 },
            { "delta", 3.0 },
            { "echo", "hydrogen" },
            { "foxtrot", L"helium" },
            { "golf", u"lithium" },
            { "hotel", U"beryllium" }
        };
    std::reverse(data.begin(), data.end());
    variable expect =
        {
            { "alpha", U"beryllium" },
            { "bravo", u"lithium" },
            { "charlie", L"helium" },
            { "delta", "hydrogen" },
            { "echo", 3.0 },
            { "foxtrot", 2 },
            { "golf", true },
            { "hotel", null }
        };
    TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), data.end(),
                                 expect.begin(), expect.end(),
                                 std::equal_to<variable>());
}